

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_export.c
# Opt level: O1

REF_STATUS ref_export_tri(REF_GRID ref_grid,char *filename)

{
  REF_NODE pRVar1;
  REF_CELL ref_cell;
  REF_GLOB *pRVar2;
  REF_DBL *pRVar3;
  bool bVar4;
  REF_STATUS RVar5;
  FILE *__stream;
  void *__ptr;
  void *__ptr_00;
  long lVar6;
  REF_INT cell;
  int iVar7;
  char *pcVar8;
  ulong uVar9;
  REF_STATUS unaff_R13D;
  ulong uVar10;
  REF_INT nodes [27];
  int local_a8;
  int local_a4;
  int local_a0;
  uint local_9c;
  
  pRVar1 = ref_grid->node;
  ref_cell = ref_grid->cell[3];
  __stream = fopen(filename,"w");
  if (__stream == (FILE *)0x0) {
    printf("unable to open %s\n",filename);
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",0xa11,
           "ref_export_tri","unable to open file");
    return 2;
  }
  if ((long)pRVar1->max < 0) {
    unaff_R13D = 1;
    pcVar8 = "malloc o2n of REF_INT negative";
LAB_0011f901:
    __ptr = (void *)0x0;
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",0xa13,
           "ref_export_tri",pcVar8);
    bVar4 = false;
  }
  else {
    __ptr = malloc((long)pRVar1->max << 2);
    if (__ptr == (void *)0x0) {
      unaff_R13D = 2;
      pcVar8 = "malloc o2n of REF_INT NULL";
      goto LAB_0011f901;
    }
    bVar4 = true;
    if (0 < pRVar1->max) {
      lVar6 = 0;
      do {
        *(undefined4 *)((long)__ptr + lVar6 * 4) = 0xffffffff;
        lVar6 = lVar6 + 1;
      } while (lVar6 < pRVar1->max);
    }
  }
  if (!bVar4) {
    return unaff_R13D;
  }
  if ((long)pRVar1->max < 0) {
    unaff_R13D = 1;
    pcVar8 = "malloc n2o of REF_INT negative";
  }
  else {
    __ptr_00 = malloc((long)pRVar1->max << 2);
    if (__ptr_00 != (void *)0x0) {
      bVar4 = true;
      if (0 < pRVar1->max) {
        lVar6 = 0;
        do {
          *(undefined4 *)((long)__ptr_00 + lVar6 * 4) = 0xffffffff;
          lVar6 = lVar6 + 1;
        } while (lVar6 < pRVar1->max);
      }
      goto LAB_0011f9ab;
    }
    unaff_R13D = 2;
    pcVar8 = "malloc n2o of REF_INT NULL";
  }
  __ptr_00 = (void *)0x0;
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",0xa14,
         "ref_export_tri",pcVar8);
  bVar4 = false;
LAB_0011f9ab:
  if (bVar4) {
    if (pRVar1->max < 1) {
      uVar10 = 0;
    }
    else {
      pRVar2 = pRVar1->global;
      lVar6 = 0;
      uVar10 = 0;
      do {
        if (((-1 < pRVar2[lVar6]) && (lVar6 < ref_cell->ref_adj->nnode)) &&
           (ref_cell->ref_adj->first[lVar6] != -1)) {
          iVar7 = (int)uVar10;
          *(int *)((long)__ptr + lVar6 * 4) = iVar7;
          *(int *)((long)__ptr_00 + (long)iVar7 * 4) = (int)lVar6;
          uVar10 = (ulong)(iVar7 + 1);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < pRVar1->max);
    }
    fprintf(__stream,"%d %d\n",uVar10,(ulong)(uint)ref_cell->n);
    if (0 < (int)uVar10) {
      uVar9 = 0;
      do {
        pRVar3 = pRVar1->real;
        lVar6 = (long)*(int *)((long)__ptr_00 + uVar9 * 4);
        fprintf(__stream,"%.16E %.16E %.16E\n",pRVar3[lVar6 * 0xf],pRVar3[lVar6 * 0xf + 1],
                pRVar3[lVar6 * 0xf + 2]);
        uVar9 = uVar9 + 1;
      } while (uVar10 != uVar9);
    }
    if (0 < ref_cell->max) {
      cell = 0;
      do {
        RVar5 = ref_cell_nodes(ref_cell,cell,&local_a8);
        if (RVar5 == 0) {
          fprintf(__stream,"%d %d %d\n",(ulong)(*(int *)((long)__ptr + (long)local_a8 * 4) + 1),
                  (ulong)(*(int *)((long)__ptr + (long)local_a4 * 4) + 1),
                  (ulong)(*(int *)((long)__ptr + (long)local_a0 * 4) + 1));
        }
        cell = cell + 1;
      } while (cell < ref_cell->max);
    }
    if (0 < ref_cell->max) {
      iVar7 = 0;
      do {
        RVar5 = ref_cell_nodes(ref_cell,iVar7,&local_a8);
        if (RVar5 == 0) {
          fprintf(__stream,"%d\n",(ulong)local_9c);
        }
        iVar7 = iVar7 + 1;
      } while (iVar7 < ref_cell->max);
    }
    if (__ptr_00 != (void *)0x0) {
      free(__ptr_00);
    }
    if (__ptr != (void *)0x0) {
      free(__ptr);
    }
    fclose(__stream);
    unaff_R13D = 0;
  }
  return unaff_R13D;
}

Assistant:

REF_FCN static REF_STATUS ref_export_tri(REF_GRID ref_grid,
                                         const char *filename) {
  FILE *f;
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT node, nnode;
  REF_INT *o2n, *n2o;
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];

  f = fopen(filename, "w");
  if (NULL == (void *)f) printf("unable to open %s\n", filename);
  RNS(f, "unable to open file");

  ref_malloc_init(o2n, ref_node_max(ref_node), REF_INT, REF_EMPTY);
  ref_malloc_init(n2o, ref_node_max(ref_node), REF_INT, REF_EMPTY);

  nnode = 0;
  each_ref_node_valid_node(ref_node, node) {
    if (!ref_cell_node_empty(ref_cell, node)) {
      o2n[node] = nnode;
      n2o[nnode] = node;
      nnode++;
    }
  }

  fprintf(f, "%d %d\n", nnode, ref_cell_n(ref_cell));
  for (node = 0; node < nnode; node++) {
    fprintf(f, "%.16E %.16E %.16E\n", ref_node_xyz(ref_node, 0, n2o[node]),
            ref_node_xyz(ref_node, 1, n2o[node]),
            ref_node_xyz(ref_node, 2, n2o[node]));
  }

  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    fprintf(f, "%d %d %d\n", o2n[nodes[0]] + 1, o2n[nodes[1]] + 1,
            o2n[nodes[2]] + 1);
  }
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    fprintf(f, "%d\n", nodes[3]);
  }

  ref_free(n2o);
  ref_free(o2n);

  fclose(f);

  return REF_SUCCESS;
}